

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O3

void __thiscall Sequence::process_itemset(Sequence *this,Itemset_S *iset,uint templ,int iter)

{
  int *piVar1;
  Itemset_S *it2;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  pointer piVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  undefined4 in_register_0000000c;
  int iVar8;
  uint ptempl;
  EqGrNode *this_00;
  Sequence *pSVar9;
  ulong uVar10;
  Itemset_S local_c8;
  Itemset_S local_b8;
  undefined8 local_a0;
  undefined1 local_98 [40];
  element_type *peStack_70;
  int esup;
  int lsup;
  Env *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Itemset_S local_50;
  Itemset_S local_40;
  
  local_a0 = CONCAT44(in_register_0000000c,iter);
  peVar2 = (this->numLargeItemset).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((ulong)(long)iter <=
      (ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    local_60 = this->env;
    local_98._32_8_ = (Env *)0x0;
    peStack_70 = (element_type *)0x0;
    local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar7 = Itemset::operator[]((iset->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr,0);
    peVar3 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar8 = (int)local_a0;
    if (peVar3->maxiter < iVar8) {
      peVar3->maxiter = iVar8;
    }
    local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)iVar7 * 0x10);
    this_00 = *(EqGrNode **)
               ((long)&(local_58._M_pi)->_vptr__Sp_counted_base +
               (long)(((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->eqgraph).
                     super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    if (this_00 != (EqGrNode *)0x0) {
      uVar10 = (ulong)(iVar8 + -1);
      local_98._28_4_ = iVar8 + 1;
      iVar7 = 0;
      it2 = (Itemset_S *)(local_98 + 0x20);
      do {
        peVar4 = (this_00->theElements).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar8 = 0;
        if (peVar4 != (element_type *)0x0) {
          iVar8 = peVar4->theSize;
        }
        if (iVar8 <= iVar7) {
          ptempl = templ | 1 << ((int)local_a0 - 2U & 0x1f);
          iVar7 = 0;
          goto LAB_00112724;
        }
        EqGrNode::get_element(this_00,iVar7);
        InvertDatabase::get_item
                  ((InvertDatabase *)local_98,
                   (int)(this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
        peVar3 = peStack_70;
        peStack_70 = (element_type *)local_98._8_8_;
        local_98._32_8_ = local_98._0_8_;
        local_98._0_8_ = (Env *)0x0;
        local_98._8_8_ = (element_type *)0x0;
        if (peVar3 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3);
          if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
          }
        }
        _Var6._M_pi = local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
        local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        prune_decision((Sequence *)local_98,(Itemset_S *)this,it2,(uint)iset,templ);
        _Var6._M_pi = local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
        local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_98._0_8_;
        local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
        if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pruning_type) {
          pre_pruning(this,&local_b8,templ,iset,it2,'\0');
        }
        if ((Env *)local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (Env *)0x0) {
          pSVar9 = this;
          get_tmpnewf_intersect
                    (this,&local_c8,&local_b8,&local_c8,&lsup,&esup,&lsup,it2,iset,(int)local_a0);
          if ((Env *)local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (Env *)0x0) {
            fill_join(pSVar9,&local_b8,iset,it2);
          }
        }
        if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pruning_type) {
          post_pruning(this,&local_b8,templ);
        }
        if ((Env *)local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (Env *)0x0) {
          peVar2 = (this->numLargeItemset).
                   super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          piVar5 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar10)
          goto LAB_00112958;
          piVar1 = piVar5 + uVar10;
          *piVar1 = *piVar1 + 1;
          if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              outputfreq != '\0') {
            Itemset::print_seq(local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(ostream *)local_60,templ);
          }
          local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((element_type *)
              local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((string *)
                        &(local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
                   *(int *)&(((string *)
                             &(local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((string *)
                        &(local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
                   *(int *)&(((string *)
                             &(local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
            }
          }
          process_itemset(this,&local_40,templ,local_98._28_4_);
          if ((element_type *)
              local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          _Var6._M_pi = local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi;
          local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
          }
        }
        iVar7 = iVar7 + 1;
        this_00 = *(EqGrNode **)
                   ((long)&(local_58._M_pi)->_vptr__Sp_counted_base +
                   (long)(((this->invdb).
                           super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         eqgraph).
                         super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      } while( true );
    }
LAB_00112919:
    if (local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    if ((element_type *)
        local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    if (peStack_70 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
    }
  }
  return;
LAB_00112724:
  peVar4 = (this_00->stheElements).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = 0;
  if (peVar4 != (element_type *)0x0) {
    iVar8 = peVar4->theSize;
  }
  if (iVar8 <= iVar7) goto LAB_00112919;
  EqGrNode::seqget_element(this_00,iVar7);
  InvertDatabase::get_item
            ((InvertDatabase *)local_98,
             (int)(this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  peVar3 = peStack_70;
  peStack_70 = (element_type *)local_98._8_8_;
  local_98._32_8_ = local_98._0_8_;
  local_98._0_8_ = (Env *)0x0;
  local_98._8_8_ = (element_type *)0x0;
  if (peVar3 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3);
    if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  _Var6._M_pi = local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_b8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
  }
  prune_decision((Sequence *)local_98,(Itemset_S *)this,it2,(uint)iset,ptempl);
  _Var6._M_pi = local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98._0_8_;
  local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
  if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
  }
  if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          pruning_type) {
    pre_pruning(this,&local_c8,ptempl,iset,it2,'\x01');
  }
  if ((Env *)local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Env *)0x0)
  {
    pSVar9 = this;
    get_tmpnewf_intersect
              (this,&local_c8,&local_b8,&local_b8,&lsup,&esup,&esup,it2,iset,(int)local_a0);
    if ((Env *)local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Env *)0x0
       ) {
      fill_join(pSVar9,&local_c8,iset,it2);
    }
  }
  if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          pruning_type) {
    post_pruning(this,&local_c8,ptempl);
  }
  if ((Env *)local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Env *)0x0)
  {
    peVar2 = (this->numLargeItemset).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    piVar5 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar10) {
LAB_00112958:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10)
      ;
    }
    piVar1 = piVar5 + uVar10;
    *piVar1 = *piVar1 + 1;
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        outputfreq != '\0') {
      Itemset::print_seq(local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ostream *)local_60,ptempl);
    }
    local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
      }
    }
    process_itemset(this,&local_50,ptempl,local_98._28_4_);
    if (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    _Var6._M_pi = local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_c8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
    }
  }
  iVar7 = iVar7 + 1;
  this_00 = *(EqGrNode **)
             ((long)&(local_58._M_pi)->_vptr__Sp_counted_base +
             (long)(((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->eqgraph).
                   super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  goto LAB_00112724;
}

Assistant:

void Sequence::process_itemset(Itemset_S iset, unsigned int templ, int iter) {
    if (iter > numLargeItemset->size()) return;

    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    int i, it2;
    int lsup, esup;
    unsigned int ntpl;
    Itemset_S iset2, ejoin, ljoin;
    int it = (*iset)[0];
    if (args->maxiter < iter) args->maxiter = iter;
    if (invdb->get_eqgraph_item(it)) {
        for (i = 0; i < invdb->get_eqgraph_item(it)->num_elements(); i++) {
            it2 = invdb->get_eqgraph_item(it)->get_element(i);
            ntpl = templ;
            iset2 = invdb->get_item(it2);
            ljoin = nullptr;
            ejoin = prune_decision(iset2, iset, ntpl, EJOIN);
            if (args->pruning_type > 1) pre_pruning(ejoin, ntpl, iset, iset2, 0);
            if (ejoin) get_tmpnewf_intersect(ljoin, ejoin, ljoin, lsup, esup, lsup, iset2, iset, iter);
            if (ejoin) fill_join(ejoin, iset, iset2);
            if (args->pruning_type > 1) post_pruning(ejoin, ntpl);
            if (ejoin) {
                numLargeItemset->at(iter - 1)++;
                //fill_join(ejoin, iset, iset2);
                //if (iter > 3) ejoin->print_seq(seqstrm, ntpl);
                if (args->outputfreq) ejoin->print_seq(seqstrm, ntpl);
                process_itemset(ejoin, ntpl, iter + 1);
                ejoin = nullptr;
            }
        }

        for (i = 0; i < invdb->get_eqgraph_item(it)->seqnum_elements(); i++) {
            it2 = invdb->get_eqgraph_item(it)->seqget_element(i);
            ntpl = SETBIT(templ, 1, iter - 2);
            iset2 = invdb->get_item(it2);
            ejoin = nullptr;
            ljoin = prune_decision(iset2, iset, ntpl, LJOIN);
            if (args->pruning_type > 1) pre_pruning(ljoin, ntpl, iset, iset2, 1);
            if (ljoin) get_tmpnewf_intersect(ljoin, ejoin, ejoin, lsup, esup, esup, iset2, iset, iter);
            if (ljoin) fill_join(ljoin, iset, iset2);
            if (args->pruning_type > 1) post_pruning(ljoin, ntpl);
            if (ljoin) {
                numLargeItemset->at(iter - 1)++;
                //fill_join(ljoin, iset, iset2);
                //if (iter > 3) ljoin->print_seq(seqstrm, ntpl);
                if (args->outputfreq) ljoin->print_seq(seqstrm, ntpl);
                process_itemset(ljoin, ntpl, iter + 1);
                ljoin = nullptr;
            }
        }
    }
}